

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepFaceArray::Read(ON_BrepFaceArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool local_62;
  bool local_61;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_50;
  bool local_49;
  ON_Color per_face_color;
  bool bHavePerFaceColors;
  ON_BrepFace *face;
  int local_38;
  int iStack_34;
  bool rc;
  int minor_version;
  int major_version;
  int i;
  int count;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON_BinaryArchive *pOStack_18;
  ON__UINT32 tcode;
  ON_BinaryArchive *file_local;
  ON_BrepFaceArray *this_local;
  
  pOStack_18 = file;
  file_local = (ON_BinaryArchive *)this;
  ON_ClassArray<ON_BrepFace>::Empty((ON_ClassArray<ON_BrepFace> *)this);
  length_TCODE_ANONYMOUS_CHUNK._4_4_ = 0;
  _i = 0;
  major_version = 0;
  iStack_34 = 0;
  local_38 = 0;
  face._7_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                         (pOStack_18,(uint *)((long)&length_TCODE_ANONYMOUS_CHUNK + 4),
                          (ON__INT64 *)&i);
  if (face._7_1_) {
    if (length_TCODE_ANONYMOUS_CHUNK._4_4_ != 0x40008000) {
      face._7_1_ = false;
    }
    if (face._7_1_ != false) {
      face._7_1_ = ON_BinaryArchive::Read3dmChunkVersion
                             (pOStack_18,&stack0xffffffffffffffcc,&local_38);
    }
    if (face._7_1_ != false) {
      if (iStack_34 == 1) {
        if (face._7_1_ != false) {
          face._7_1_ = ON_BinaryArchive::ReadInt(pOStack_18,&major_version);
        }
        ON_ClassArray<ON_BrepFace>::SetCapacity
                  ((ON_ClassArray<ON_BrepFace> *)this,(long)major_version);
        minor_version = 0;
        while( true ) {
          local_61 = false;
          if (minor_version < major_version) {
            local_61 = face._7_1_;
          }
          if (local_61 == false) break;
          _per_face_color =
               ON_ClassArray<ON_BrepFace>::AppendNew((ON_ClassArray<ON_BrepFace> *)this);
          iVar2 = (*(_per_face_color->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.
                    super_ON_Object._vptr_ON_Object[0xb])(_per_face_color,pOStack_18);
          face._7_1_ = (bool)(-(char)iVar2 & 1);
          minor_version = minor_version + 1;
        }
        if (0 < local_38) {
          minor_version = 0;
          while( true ) {
            local_62 = false;
            if (minor_version < major_version) {
              local_62 = face._7_1_;
            }
            if (local_62 == false) break;
            face._7_1_ = ON_BinaryArchive::ReadUuid
                                   (pOStack_18,
                                    &(this->super_ON_ObjectArray<ON_BrepFace>).
                                     super_ON_ClassArray<ON_BrepFace>.m_a[minor_version].m_face_uuid
                                   );
            minor_version = minor_version + 1;
          }
          if ((face._7_1_ != false) && (1 < local_38)) {
            local_49 = false;
            face._7_1_ = ON_BinaryArchive::ReadBool(pOStack_18,&local_49);
            if ((face._7_1_) && ((local_49 & 1U) != 0)) {
              for (minor_version = 0; face._7_1_ != false && minor_version < major_version;
                  minor_version = minor_version + 1) {
                local_50 = ON_Color::UnsetColor.field_0;
                face._7_1_ = ON_BinaryArchive::ReadColor(pOStack_18,(ON_Color *)&local_50);
                if (face._7_1_) {
                  uVar3 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
                  uVar4 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_50);
                  if (uVar3 != uVar4) {
                    ON_BrepFace::SetPerFaceColor
                              ((this->super_ON_ObjectArray<ON_BrepFace>).
                               super_ON_ClassArray<ON_BrepFace>.m_a + minor_version,
                               (ON_Color)local_50);
                  }
                }
              }
            }
          }
        }
      }
      else {
        face._7_1_ = false;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_18);
    if (!bVar1) {
      face._7_1_ = false;
    }
  }
  return face._7_1_;
}

Assistant:

bool ON_BrepFaceArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) 
      {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) 
        {
          ON_BrepFace& face = AppendNew();
          rc = face.Read(file)?true:false;
        }    

        if ( minor_version >= 1 )
        {
          // chunk version 1.1 and later has face uuids
          for ( i = 0; i < count && rc; i++ )
          {
            rc = file.ReadUuid( m_a[i].m_face_uuid );
          }

          if (rc && minor_version >= 2)
          {
            // chunk version 1.2 and later has per face colors
            bool bHavePerFaceColors = false;
            rc = file.ReadBool(&bHavePerFaceColors);
            if (rc && bHavePerFaceColors)
            {
              for (i = 0; rc && i < count; i++)
              {
                ON_Color per_face_color = ON_Color::UnsetColor;
                rc = file.ReadColor(per_face_color);
                if (rc && ON_Color::UnsetColor != per_face_color)
                  m_a[i].SetPerFaceColor(per_face_color);
              }
            }
          }
        }
      }
      else 
      {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}